

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_specialization_constant_op
          (CompilerGLSL *this,SPIRConstantOp *constant)

{
  SPIRType *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string name;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(constant->basetype).id);
  add_resource_name(this,(constant->super_IVariant).self.id);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&name,this,(ulong)(constant->super_IVariant).self.id,1);
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_60,this,pSVar1,&name,0);
  (*(this->super_Compiler)._vptr_Compiler[0x18])(&local_80,this,constant);
  statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,(char (*) [7])0x3a9a55,&local_60,(char (*) [4])0x3b58ce,&local_80,
             (char (*) [2])0x39d4f0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CompilerGLSL::emit_specialization_constant_op(const SPIRConstantOp &constant)
{
	auto &type = get<SPIRType>(constant.basetype);
	add_resource_name(constant.self);
	auto name = to_name(constant.self);
	statement("const ", variable_decl(type, name), " = ", constant_op_expression(constant), ";");
}